

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall
MT32Emu::RendererImpl<float>::doRenderAndConvert<short>
          (RendererImpl<float> *this,short *stereoStream,Bit32u len)

{
  Bit32u local_803c;
  float local_8028;
  Bit32u thisPassLen;
  float renderingBuffer [8192];
  uint local_1c;
  short *psStack_18;
  Bit32u len_local;
  short *stereoStream_local;
  RendererImpl<float> *this_local;
  
  psStack_18 = stereoStream;
  for (local_1c = len; local_1c != 0; local_1c = local_1c - local_803c) {
    if (local_1c < 0x1001) {
      local_803c = local_1c;
    }
    else {
      local_803c = 0x1000;
    }
    doRender(this,&local_8028,local_803c);
    convertSampleFormat<float,short>(&local_8028,psStack_18,local_803c << 1);
    psStack_18 = psStack_18 + (local_803c << 1);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderAndConvert(O *stereoStream, Bit32u len) {
	Sample renderingBuffer[MAX_SAMPLES_PER_RUN << 1];
	while (len > 0) {
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRender(renderingBuffer, thisPassLen);
		convertSampleFormat(renderingBuffer, stereoStream, thisPassLen << 1);
		stereoStream += thisPassLen << 1;
		len -= thisPassLen;
	}
}